

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O3

Relations dg::vr::compose(Relations *lt,Relations *rt)

{
  Type fst;
  bitset<12UL> bVar1;
  ulong uVar2;
  bool bVar3;
  Type TVar4;
  long lVar5;
  Relations RVar6;
  _WordT _Var7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  _Base_bitset<1UL> local_38;
  
  bVar1.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(lt->bits).super__Base_bitset<1UL>._M_w;
  local_38._M_w = (rt->bits).super__Base_bitset<1UL>._M_w;
  if ((((ulong)bVar1.super__Base_bitset<1UL>._M_w & 1) == 0) &&
     (uVar2 = local_38._M_w & 1, local_38._M_w = (_WordT)bVar1.super__Base_bitset<1UL>._M_w,
     uVar2 == 0)) {
    lVar5 = 0;
    _Var7 = 0;
    do {
      fst = *(Type *)((long)&Relations::all + lVar5);
      if (((lt->bits).super__Base_bitset<1UL>._M_w >> ((ulong)fst & 0x3f) & 1) != 0) {
        lVar10 = 0;
        do {
          TVar4 = *(Type *)((long)&Relations::all + lVar10);
          if ((((rt->bits).super__Base_bitset<1UL>._M_w >> ((ulong)TVar4 & 0x3f) & 1) != 0) &&
             (bVar3 = Relations::transitiveOver(fst,TVar4), bVar3)) {
            if ((((uint)(1L << ((byte)TVar4 & 0x3f)) | (uint)(1L << ((byte)fst & 0x3f))) & 0x2a8) ==
                0) {
              if (PF < fst) {
                pcVar9 = "%s: __position (which is %zu) >= _Nb (which is %zu)";
                uVar8 = 0x102164;
                std::__throw_out_of_range_fmt
                          ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                           (ulong)fst,0xc);
                if (0xb < (uint)pcVar9) {
                  abort();
                }
                switch((ulong)pcVar9 & 0xffffffff) {
                default:
                  return (Relations)0;
                case 2:
                case 3:
                  bVar3 = (uVar8 & 0xfffffffe) == 2;
                  break;
                case 4:
                case 5:
                  bVar3 = (uVar8 & 0xfffffffe) == 4;
                  break;
                case 6:
                case 7:
                  bVar3 = (uVar8 & 0xfffffffe) == 6;
                  break;
                case 8:
                case 9:
                  bVar3 = (uVar8 & 0xfffffffe) == 8;
                }
                RVar6.bits.super__Base_bitset<1UL>._M_w._1_7_ =
                     (undefined7)
                     ((ulong)((long)&switchD_001014bb::switchdataD_00102000 +
                             (long)(int)(&switchD_001014bb::switchdataD_00102000)
                                        [(ulong)pcVar9 & 0xffffffff]) >> 8);
                RVar6.bits.super__Base_bitset<1UL>._M_w._0_1_ = bVar3;
                return (Relations)RVar6.bits.super__Base_bitset<1UL>._M_w;
              }
              _Var7 = _Var7 | 1L << ((byte)fst & 0x3f);
            }
            else {
              TVar4 = Relations::getStrict(fst);
              _Var7 = _Var7 | 1L << ((ulong)TVar4 & 0x3f);
            }
          }
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0x30);
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x30);
    local_38._M_w = _Var7;
    Relations::addImplied((Relations *)&local_38);
  }
  return (Relations)local_38._M_w;
}

Assistant:

Relations compose(const Relations &lt, const Relations &rt) {
    if (lt.has(Relations::EQ))
        return rt;
    if (rt.has(Relations::EQ))
        return lt;
    Relations result;
    for (Relations::Type ltRel : Relations::all) {
        if (!lt.has(ltRel))
            continue;

        for (Relations::Type rtRel : Relations::all) {
            if (rt.has(rtRel) && Relations::transitiveOver(ltRel, rtRel)) {
                if (Relations::isStrict(ltRel) || Relations::isStrict(rtRel))
                    result.set(Relations::getStrict(ltRel));
                else
                    result.set(ltRel);
            }
        }
    }
    return result.addImplied();
}